

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::emit(Poppifier *this,Expression *curr)

{
  Id IVar1;
  bool bVar2;
  Expression *pEVar3;
  If *pIVar4;
  TupleExtract *curr_00;
  Drop *curr_01;
  LocalGet *curr_02;
  LocalSet *curr_03;
  GlobalGet *curr_04;
  GlobalSet *curr_05;
  reference pvVar5;
  GlobalSet *set_1;
  GlobalGet *get_1;
  LocalSet *set;
  LocalGet *get;
  Drop *drop;
  TupleExtract *extract;
  Kind local_1c;
  Expression *pEStack_18;
  Kind kind;
  Expression *curr_local;
  Poppifier *this_local;
  
  pEStack_18 = curr;
  curr_local = (Expression *)this;
  bVar2 = Properties::isControlFlowStructure(curr);
  if (bVar2) {
    IVar1 = pEStack_18->_id;
    if (IVar1 == BlockId) {
      local_1c = Block;
    }
    else if (IVar1 == IfId) {
      wasm::Type::Type((Type *)&extract,i32);
      pEVar3 = (Expression *)Builder::makePop(&this->builder,(Type)extract);
      pIVar4 = Expression::cast<wasm::If>(pEStack_18);
      pIVar4->condition = pEVar3;
      local_1c = If;
    }
    else if (IVar1 == LoopId) {
      local_1c = Loop;
    }
    else {
      if (IVar1 != TryId) {
        handle_unreachable("Unexpected control flow structure",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                           ,0xd8);
      }
      local_1c = Try;
    }
    std::
    vector<wasm::(anonymous_namespace)::Poppifier::Scope,std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>>
    ::emplace_back<wasm::(anonymous_namespace)::Poppifier::Scope::Kind&>
              ((vector<wasm::(anonymous_namespace)::Poppifier::Scope,std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>>
                *)&this->scopeStack,&local_1c);
  }
  else {
    bVar2 = Expression::is<wasm::Pop>(pEStack_18);
    if ((!bVar2) && (bVar2 = Expression::is<wasm::TupleMake>(pEStack_18), !bVar2)) {
      curr_00 = Expression::dynCast<wasm::TupleExtract>(pEStack_18);
      if (curr_00 == (TupleExtract *)0x0) {
        curr_01 = Expression::dynCast<wasm::Drop>(pEStack_18);
        if (curr_01 == (Drop *)0x0) {
          curr_02 = Expression::dynCast<wasm::LocalGet>(pEStack_18);
          if (curr_02 == (LocalGet *)0x0) {
            curr_03 = Expression::dynCast<wasm::LocalSet>(pEStack_18);
            if (curr_03 == (LocalSet *)0x0) {
              curr_04 = Expression::dynCast<wasm::GlobalGet>(pEStack_18);
              if (curr_04 == (GlobalGet *)0x0) {
                curr_05 = Expression::dynCast<wasm::GlobalSet>(pEStack_18);
                if (curr_05 == (GlobalSet *)0x0) {
                  poppify(this,pEStack_18);
                  pvVar5 = std::
                           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
                           ::back(&this->scopeStack);
                  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                            (&pvVar5->instrs,&stack0xffffffffffffffe8);
                }
                else {
                  emitGlobalSet(this,curr_05);
                }
              }
              else {
                emitGlobalGet(this,curr_04);
              }
            }
            else {
              emitLocalSet(this,curr_03);
            }
          }
          else {
            emitLocalGet(this,curr_02);
          }
        }
        else {
          emitDrop(this,curr_01);
        }
      }
      else {
        emitTupleExtract(this,curr_00);
      }
    }
  }
  return;
}

Assistant:

void Poppifier::emit(Expression* curr) {
  // Control flow structures introduce new scopes. The instructions collected
  // for the new scope will be patched back into the original Expression when
  // the scope ends.
  if (Properties::isControlFlowStructure(curr)) {
    Scope::Kind kind;
    switch (curr->_id) {
      case Expression::BlockId: {
        kind = Scope::Block;
        break;
      }
      case Expression::LoopId: {
        kind = Scope::Loop;
        break;
      }
      case Expression::IfId:
        // The condition has already been emitted
        curr->cast<If>()->condition = builder.makePop(Type::i32);
        kind = Scope::If;
        break;
      case Expression::TryId:
        kind = Scope::Try;
        break;
      default:
        WASM_UNREACHABLE("Unexpected control flow structure");
    }
    scopeStack.emplace_back(kind);
  } else if (curr->is<Pop>()) {
    // Turns into nothing when poppified
    return;
  } else if (curr->is<TupleMake>()) {
    // Turns into nothing when poppified
    return;
  } else if (auto* extract = curr->dynCast<TupleExtract>()) {
    emitTupleExtract(extract);
  } else if (auto* drop = curr->dynCast<Drop>()) {
    emitDrop(drop);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    emitLocalGet(get);
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    emitLocalSet(set);
  } else if (auto* get = curr->dynCast<GlobalGet>()) {
    emitGlobalGet(get);
  } else if (auto* set = curr->dynCast<GlobalSet>()) {
    emitGlobalSet(set);
  } else {
    // Replace all children (which have already been emitted) with pops and emit
    // the current instruction into the current scope.
    poppify(curr);
    scopeStack.back().instrs.push_back(curr);
  }
}